

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reduction_job.tpl.h
# Opt level: O0

bool __thiscall
r_exec::BatchReductionJob<r_exec::SecondaryMDLController,_r_exec::Fact,_r_exec::MDLController>::
update(BatchReductionJob<r_exec::SecondaryMDLController,_r_exec::Fact,_r_exec::MDLController> *this,
      uint64_t now)

{
  _Mem *this_00;
  SecondaryMDLController *this_01;
  Fact *f_p_f_imdl;
  MDLController *controller;
  uint64_t now_local;
  BatchReductionJob<r_exec::SecondaryMDLController,_r_exec::Fact,_r_exec::MDLController> *this_local
  ;
  
  this_00 = _Mem::Get();
  _Mem::register_reduction_job_latency(this_00,now - (this->super__ReductionJob).ijt);
  this_01 = core::P<r_exec::SecondaryMDLController>::operator->(&this->processor);
  f_p_f_imdl = core::P::operator_cast_to_Fact_((P *)&this->trigger);
  controller = core::P::operator_cast_to_MDLController_((P *)&this->controller);
  SecondaryMDLController::reduce_batch(this_01,f_p_f_imdl,controller);
  return true;
}

Assistant:

bool BatchReductionJob<_P, T, C>::update(uint64_t now)
{
    _Mem::Get()->register_reduction_job_latency(now - ijt);
    processor->reduce_batch(trigger, controller);
    return true;
}